

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

char * __thiscall QFileSystemModel::index(QFileSystemModel *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  QFileSystemModelPrivate *pQVar3;
  QList<QString> *this_00;
  qsizetype qVar4;
  int in_ECX;
  undefined8 in_R8;
  QFileSystemNode *indexNode;
  QString *childName;
  int i;
  QFileSystemNode *parentNode;
  QFileSystemModelPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QFileSystemNode *in_stack_ffffffffffffff90;
  QFileSystemModelPrivate *in_stack_ffffffffffffff98;
  QFileSystemModelPrivate *this_01;
  
  pQVar3 = d_func((QFileSystemModel *)0xaa3133);
  if ((((__c < 0) || (in_ECX < 0)) ||
      (iVar2 = (**(code **)(*(long *)__s + 0x78))(__s,in_R8), iVar2 <= __c)) ||
     (iVar2 = (**(code **)(*(long *)__s + 0x80))(__s,in_R8), iVar2 <= in_ECX)) {
    QModelIndex::QModelIndex((QModelIndex *)0xaa3197);
    return (char *)this;
  }
  bVar1 = QAbstractItemModelPrivate::indexValid
                    ((QAbstractItemModelPrivate *)CONCAT44(__c,in_ECX),
                     (QModelIndex *)in_stack_ffffffffffffff98);
  if (bVar1) {
    pQVar3 = (QFileSystemModelPrivate *)
             QFileSystemModelPrivate::node
                       (in_stack_ffffffffffffff98,(QModelIndex *)in_stack_ffffffffffffff90);
  }
  else {
    pQVar3 = (QFileSystemModelPrivate *)&pQVar3->root;
  }
  this_01 = pQVar3;
  iVar2 = QFileSystemModelPrivate::translateVisibleLocation
                    (pQVar3,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  this_00 = (QList<QString> *)(long)iVar2;
  qVar4 = QList<QString>::size((QList<QString> *)&pQVar3->field_0x20);
  if (qVar4 <= (long)this_00) {
    QModelIndex::QModelIndex((QModelIndex *)0xaa3227);
    return (char *)this;
  }
  QList<QString>::at(this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
            ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)this_01,
             (QString *)this_00);
  QAbstractItemModel::createIndex
            ((QAbstractItemModel *)CONCAT44(__c,in_ECX),(int)((ulong)this_01 >> 0x20),(int)this_01,
             this_00);
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (row < 0 || column < 0 || row >= rowCount(parent) || column >= columnCount(parent))
        return QModelIndex();

    // get the parent node
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (d->indexValid(parent) ? d->node(parent) :
                                                   const_cast<QFileSystemModelPrivate::QFileSystemNode*>(&d->root));
    Q_ASSERT(parentNode);

    // now get the internal pointer for the index
    const int i = d->translateVisibleLocation(parentNode, row);
    if (i >= parentNode->visibleChildren.size())
        return QModelIndex();
    const QString &childName = parentNode->visibleChildren.at(i);
    const QFileSystemModelPrivate::QFileSystemNode *indexNode = parentNode->children.value(childName);
    Q_ASSERT(indexNode);

    return createIndex(row, column, indexNode);
}